

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCVS.cxx
# Opt level: O1

bool __thiscall cmCTestCVS::UpdateParser::ProcessLine(UpdateParser *this)

{
  char *pcVar1;
  bool bVar2;
  string local_28;
  
  bVar2 = cmsys::RegularExpression::find
                    (&this->RegexFileUpdated,(this->super_LineParser).Line._M_dataplus._M_p,
                     &(this->RegexFileUpdated).regmatch);
  if (bVar2) {
    pcVar1 = (this->RegexFileUpdated).regmatch.startp[2];
    if (pcVar1 == (char *)0x0) {
      local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
      local_28._M_string_length = 0;
      local_28.field_2._M_local_buf[0] = '\0';
    }
    else {
      local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_28,pcVar1,(this->RegexFileUpdated).regmatch.endp[2]);
    }
    DoFile(this,PathUpdated,&local_28);
  }
  else {
    bVar2 = cmsys::RegularExpression::find
                      (&this->RegexFileModified,(this->super_LineParser).Line._M_dataplus._M_p,
                       &(this->RegexFileModified).regmatch);
    if (bVar2) {
      pcVar1 = (this->RegexFileModified).regmatch.startp[2];
      if (pcVar1 == (char *)0x0) {
        local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
        local_28._M_string_length = 0;
        local_28.field_2._M_local_buf[0] = '\0';
      }
      else {
        local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_28,pcVar1,(this->RegexFileModified).regmatch.endp[2]);
      }
      DoFile(this,PathModified,&local_28);
    }
    else {
      bVar2 = cmsys::RegularExpression::find
                        (&this->RegexFileConflicting,(this->super_LineParser).Line._M_dataplus._M_p,
                         &(this->RegexFileConflicting).regmatch);
      if (bVar2) {
        pcVar1 = (this->RegexFileConflicting).regmatch.startp[2];
        if (pcVar1 == (char *)0x0) {
          local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
          local_28._M_string_length = 0;
          local_28.field_2._M_local_buf[0] = '\0';
        }
        else {
          local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_28,pcVar1,(this->RegexFileConflicting).regmatch.endp[2]);
        }
        DoFile(this,PathConflicting,&local_28);
      }
      else {
        bVar2 = cmsys::RegularExpression::find
                          (&this->RegexFileRemoved1,(this->super_LineParser).Line._M_dataplus._M_p,
                           &(this->RegexFileRemoved1).regmatch);
        if (bVar2) {
          pcVar1 = (this->RegexFileRemoved1).regmatch.startp[1];
          if (pcVar1 == (char *)0x0) {
            local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
            local_28._M_string_length = 0;
            local_28.field_2._M_local_buf[0] = '\0';
          }
          else {
            local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_28,pcVar1,(this->RegexFileRemoved1).regmatch.endp[1]);
          }
          DoFile(this,PathUpdated,&local_28);
        }
        else {
          bVar2 = cmsys::RegularExpression::find
                            (&this->RegexFileRemoved2,(this->super_LineParser).Line._M_dataplus._M_p
                             ,&(this->RegexFileRemoved2).regmatch);
          if (!bVar2) {
            return true;
          }
          pcVar1 = (this->RegexFileRemoved2).regmatch.startp[1];
          if (pcVar1 == (char *)0x0) {
            local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
            local_28._M_string_length = 0;
            local_28.field_2._M_local_buf[0] = '\0';
          }
          else {
            local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_28,pcVar1,(this->RegexFileRemoved2).regmatch.endp[1]);
          }
          DoFile(this,PathUpdated,&local_28);
        }
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,
                    CONCAT71(local_28.field_2._M_allocated_capacity._1_7_,
                             local_28.field_2._M_local_buf[0]) + 1);
  }
  return true;
}

Assistant:

bool ProcessLine() override
  {
    if (this->RegexFileUpdated.find(this->Line)) {
      this->DoFile(PathUpdated, this->RegexFileUpdated.match(2));
    } else if (this->RegexFileModified.find(this->Line)) {
      this->DoFile(PathModified, this->RegexFileModified.match(2));
    } else if (this->RegexFileConflicting.find(this->Line)) {
      this->DoFile(PathConflicting, this->RegexFileConflicting.match(2));
    } else if (this->RegexFileRemoved1.find(this->Line)) {
      this->DoFile(PathUpdated, this->RegexFileRemoved1.match(1));
    } else if (this->RegexFileRemoved2.find(this->Line)) {
      this->DoFile(PathUpdated, this->RegexFileRemoved2.match(1));
    }
    return true;
  }